

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOUAmount.cpp
# Opt level: O3

IOUAmount jbcoin::mulRatio(IOUAmount *amt,uint32_t num,uint32_t den,bool roundUp)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  undefined7 in_register_00000009;
  pointer pnVar17;
  ulong uVar18;
  int iVar19;
  undefined4 in_register_00000034;
  anon_class_1_0_00000001 *this;
  ulong uVar20;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__return_storage_ptr__;
  difference_type __d;
  long lVar21;
  bool bVar22;
  IOUAmount IVar23;
  IOUAmount result;
  number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  low;
  uint128_t rem;
  uint128_t den128;
  uint128_t mul;
  terminal local_b9;
  IOUAmount local_b8;
  cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
  local_a8;
  undefined4 local_8c;
  IOUAmount local_88;
  cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
  local_78;
  ulong local_60;
  cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
  local_58;
  cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
  local_48;
  
  this = (anon_class_1_0_00000001 *)CONCAT44(in_register_00000034,num);
  local_8c = (undefined4)CONCAT71(in_register_00000009,roundUp);
  if (den == 0) {
    Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"division by zero");
  }
  if (mulRatio(jbcoin::IOUAmount_const&,unsigned_int,unsigned_int,bool)::powerTable == '\0') {
    __return_storage_ptr__ =
         (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          *)&mulRatio(jbcoin::IOUAmount_const&,unsigned_int,unsigned_int,bool)::powerTable;
    iVar19 = __cxa_guard_acquire();
    if (iVar19 != 0) {
      mulRatio::anon_class_1_0_00000001::operator()(__return_storage_ptr__,this);
      __cxa_atexit(std::
                   vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ::~vector,&mulRatio::powerTable,&__dso_handle);
      __cxa_guard_release(&mulRatio(jbcoin::IOUAmount_const&,unsigned_int,unsigned_int,bool)::
                           powerTable);
    }
  }
  if (mulRatio(jbcoin::IOUAmount_const&,unsigned_int,unsigned_int,bool)::fl64 == '\0') {
    mulRatio();
  }
  local_60 = amt->mantissa_;
  local_58.
  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
  .m_data._0_8_ = (ulong)den;
  local_58.
  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
  .m_data._8_8_ = 0;
  uVar14 = -local_60;
  if (0 < (long)local_60) {
    uVar14 = local_60;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar14;
  local_48.
  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
  .m_data = (cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
             )(auVar2 * ZEXT416(num));
  local_a8.
  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
  .m_data._0_8_ = 0;
  local_a8.
  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
  .m_data._8_8_ = 0;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_int_backend<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,boost::multiprecision::backends::cpp_int_backend<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,boost::multiprecision::backends::cpp_int_backend<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>>
            (&local_a8,&local_48,&local_58);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (ulong)local_58.
                        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                        .m_data;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (ulong)local_a8.
                        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                        .m_data;
  uVar14 = SUB168(auVar3 * auVar8,0);
  local_78.
  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
  .m_data._0_8_ =
       (ulong)local_48.
              super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
              .m_data - uVar14;
  local_78.
  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
  .m_data._8_8_ =
       (local_48.
        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
        .m_data._8_8_ -
       (local_58.
        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
        .m_data._8_8_ *
        (ulong)local_a8.
               super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
               .m_data +
       SUB168(auVar3 * auVar8,8) +
       (ulong)local_58.
              super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
              .m_data *
       local_a8.
       super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
       .m_data._8_8_)) -
       (ulong)((ulong)local_48.
                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                      .m_data < uVar14);
  iVar19 = amt->exponent_;
  if ((ulong)local_78.
             super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
             .m_data == 0 &&
      local_78.
      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data._8_8_ == 0) {
    bVar22 = false;
  }
  else {
    uVar14 = (long)mulRatio::powerTable.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)mulRatio::powerTable.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
    pnVar17 = mulRatio::powerTable.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while (uVar18 = uVar14, 0 < (long)uVar18) {
      uVar14 = uVar18 >> 1;
      uVar20 = *(ulong *)((long)&pnVar17[uVar14].m_backend.
                                 super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                 .m_data + 8);
      if (uVar20 < local_a8.
                   super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                   .m_data._8_8_ ||
          uVar20 - local_a8.
                   super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                   .m_data._8_8_ <
          (ulong)((ulong)pnVar17[uVar14].m_backend.
                         super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                         .m_data <
                 (ulong)local_a8.
                        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                        .m_data)) {
        pnVar17 = pnVar17 + uVar14 + 1;
        uVar14 = ~uVar14 + uVar18;
      }
    }
    iVar16 = (int)((ulong)((long)pnVar17 -
                          (long)mulRatio::powerTable.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4);
    uVar13 = mulRatio::fl64 - iVar16;
    if (uVar13 != 0 && iVar16 <= mulRatio::fl64) {
      iVar19 = iVar19 - uVar13;
      uVar14 = (ulong)mulRatio::powerTable.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar13].m_backend.
                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                      .m_data;
      lVar21 = *(long *)((long)&mulRatio::powerTable.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar13].m_backend.
                                super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                .m_data + 8) *
               (ulong)local_a8.
                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                      .m_data;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar14;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = (ulong)local_a8.
                            super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                            .m_data;
      local_a8.
      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data._0_8_ = SUB168(auVar4 * auVar9,0);
      local_a8.
      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data._8_8_ =
           SUB168(auVar4 * auVar9,8) +
           local_a8.
           super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
           .m_data._8_8_ * uVar14 + lVar21;
      uVar14 = (ulong)mulRatio::powerTable.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar13].m_backend.
                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                      .m_data;
      lVar21 = *(long *)((long)&mulRatio::powerTable.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar13].m_backend.
                                super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                .m_data + 8) *
               (ulong)local_78.
                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                      .m_data;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar14;
      auVar10._8_8_ = 0;
      auVar10._0_8_ =
           (ulong)local_78.
                  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                  .m_data;
      local_78.
      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data._0_8_ = SUB168(auVar5 * auVar10,0);
      local_78.
      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data._8_8_ =
           SUB168(auVar5 * auVar10,8) +
           local_78.
           super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
           .m_data._8_8_ * uVar14 + lVar21;
    }
    local_b8.mantissa_ = 0;
    local_b8._8_8_ = 0;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_int_backend<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,boost::multiprecision::backends::cpp_int_backend<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,boost::multiprecision::backends::cpp_int_backend<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>>
              ((cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
                *)&local_b8,&local_78,&local_58);
    bVar22 = CARRY8((ulong)local_a8.
                           super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                           .m_data,local_b8.mantissa_);
    local_a8.
    super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
    .m_data._0_8_ =
         local_b8.mantissa_ +
         (ulong)local_a8.
                super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                .m_data;
    local_a8.
    super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
    .m_data._8_8_ =
         local_a8.
         super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
         .m_data._8_8_ + local_b8._8_8_ + (ulong)bVar22;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (ulong)local_58.
                          super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                          .m_data;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_b8.mantissa_;
    uVar14 = SUB168(auVar6 * auVar11,0);
    bVar22 = (ulong)local_78.
                    super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                    .m_data < uVar14;
    local_78.
    super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
    .m_data._0_8_ =
         (ulong)local_78.
                super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                .m_data - uVar14;
    local_78.
    super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
    .m_data._8_8_ =
         (local_78.
          super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
          .m_data._8_8_ -
         (local_b8.mantissa_ *
          local_58.
          super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
          .m_data._8_8_ +
         SUB168(auVar6 * auVar11,8) +
         local_b8._8_8_ *
         (ulong)local_58.
                super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                .m_data)) - (ulong)bVar22;
    bVar22 = local_78.
             super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
             .m_data._8_8_ != 0 ||
             (ulong)local_78.
                    super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                    .m_data != 0;
  }
  uVar18 = local_a8.
           super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
           .m_data._8_8_;
  uVar14 = (ulong)local_a8.
                  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                  .m_data;
  uVar20 = (long)mulRatio::powerTable.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)mulRatio::powerTable.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4;
  pnVar17 = mulRatio::powerTable.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while (uVar15 = uVar20, 0 < (long)uVar15) {
    uVar20 = uVar15 >> 1;
    uVar1 = *(ulong *)((long)&pnVar17[uVar20].m_backend.
                              super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                              .m_data + 8);
    if (uVar1 < local_a8.
                super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                .m_data._8_8_ ||
        uVar1 - local_a8.
                super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                .m_data._8_8_ <
        (ulong)((ulong)pnVar17[uVar20].m_backend.
                       super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                       .m_data <
               (ulong)local_a8.
                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                      .m_data)) {
      pnVar17 = pnVar17 + uVar20 + 1;
      uVar20 = ~uVar20 + uVar15;
    }
  }
  iVar16 = (int)((ulong)((long)pnVar17 -
                        (long)mulRatio::powerTable.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4);
  uVar13 = iVar16 - mulRatio::fl64;
  if (uVar13 != 0 && mulRatio::fl64 <= iVar16) {
    iVar19 = iVar19 + uVar13;
    local_b8.mantissa_ =
         (int64_t)(mulRatio::powerTable.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar13);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
    ::
    do_divide<boost::multiprecision::detail::expression<boost::multiprecision::detail::terminal,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>,void,void,void>>
              ((number<boost::multiprecision::backends::cpp_int_backend<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
                *)&local_a8,
               (expression<boost::multiprecision::detail::terminal,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_void,_void,_void>
                *)&local_b8,&local_b9);
    if (bVar22) {
      bVar22 = true;
    }
    else {
      uVar20 = (ulong)mulRatio::powerTable.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar13].m_backend.
                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                      .m_data;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar20;
      auVar12._8_8_ = 0;
      auVar12._0_8_ =
           (ulong)local_a8.
                  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                  .m_data;
      uVar15 = SUB168(auVar7 * auVar12,0);
      bVar22 = uVar18 - (SUB168(auVar7 * auVar12,8) +
                         uVar20 * local_a8.
                                  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                  .m_data._8_8_ +
                        *(long *)((long)&mulRatio::powerTable.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar13].m_backend
                                         .
                                         super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                         .m_data + 8) *
                        (ulong)local_a8.
                               super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                               .m_data) != (ulong)(uVar14 < uVar15) || uVar14 != uVar15;
    }
  }
  uVar14 = local_60;
  uVar18 = (ulong)local_a8.
                  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                  .m_data;
  if (0x7ffffffffffffffe <
      (ulong)local_a8.
             super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
             .m_data) {
    uVar18 = 0x7fffffffffffffff;
  }
  if (local_a8.
      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data._8_8_ != 0) {
    uVar18 = 0x7fffffffffffffff;
  }
  local_b8.mantissa_ = -uVar18;
  if (-1 < (long)local_60) {
    local_b8.mantissa_ = uVar18;
  }
  local_b8.exponent_ = iVar19;
  IOUAmount::normalize(&local_b8);
  if (!bVar22) {
LAB_001bbeb6:
    local_88.mantissa_ = local_b8.mantissa_;
    local_88.exponent_ = local_b8.exponent_;
    goto LAB_001bbf0a;
  }
  if ((char)local_8c == '\x01' && -1 < (long)uVar14) {
    if (local_b8.mantissa_ == 0) {
      local_88.mantissa_ = 1000000000000000;
      goto LAB_001bbef6;
    }
    local_88.mantissa_ = local_b8.mantissa_ + 1;
LAB_001bbecf:
    local_88.exponent_ = local_b8.exponent_;
  }
  else {
    if (-1 < (long)uVar14 || (char)local_8c != '\0') goto LAB_001bbeb6;
    if (local_b8.mantissa_ != 0) {
      local_88.mantissa_ = local_b8.mantissa_ - 1;
      goto LAB_001bbecf;
    }
    local_88.mantissa_ = 0xfffc72815b398000;
LAB_001bbef6:
    local_88.exponent_ = -0x60;
  }
  IOUAmount::normalize(&local_88);
LAB_001bbf0a:
  IVar23.exponent_ = local_88.exponent_;
  IVar23.mantissa_ = local_88.mantissa_;
  IVar23._12_4_ = 0;
  return IVar23;
}

Assistant:

IOUAmount
mulRatio (
    IOUAmount const& amt,
    std::uint32_t num,
    std::uint32_t den,
    bool roundUp)
{
    using namespace boost::multiprecision;

    if (!den)
        Throw<std::runtime_error> ("division by zero");

    // A vector with the value 10^index for indexes from 0 to 29
    // The largest intermediate value we expect is 2^96, which
    // is less than 10^29
    static auto const powerTable = []
    {
        std::vector<uint128_t> result;
        result.reserve (30);  // 2^96 is largest intermediate result size
        uint128_t cur (1);
        for (int i = 0; i < 30; ++i)
        {
            result.push_back (cur);
            cur *= 10;
        };
        return result;
    }();

    // Return floor(log10(v))
    // Note: Returns -1 for v == 0
    static auto log10Floor = [](uint128_t const& v)
    {
        // Find the index of the first element >= the requested element, the index
        // is the log of the element in the log table.
        auto const l = std::lower_bound (powerTable.begin (), powerTable.end (), v);
        int index = std::distance (powerTable.begin (), l);
        // If we're not equal, subtract to get the floor
        if (*l != v)
            --index;
        return index;
    };

    // Return ceil(log10(v))
    static auto log10Ceil = [](uint128_t const& v)
    {
        // Find the index of the first element >= the requested element, the index
        // is the log of the element in the log table.
        auto const l = std::lower_bound (powerTable.begin (), powerTable.end (), v);
        return int(std::distance (powerTable.begin (), l));
    };

    static auto const fl64 =
        log10Floor (std::numeric_limits<std::int64_t>::max ());

    bool const neg = amt.mantissa () < 0;
    uint128_t const den128 (den);
    // a 32 value * a 64 bit value and stored in a 128 bit value. This will never overflow
    uint128_t const mul =
        uint128_t (neg ? -amt.mantissa () : amt.mantissa ()) * uint128_t (num);

    auto low = mul / den128;
    uint128_t rem (mul - low * den128);

    int exponent = amt.exponent ();

    if (rem)
    {
        // Mathematically, the result is low + rem/den128. However, since this
        // uses integer division rem/den128 will be zero. Scale the result so
        // low does not overflow the largest amount we can store in the mantissa
        // and (rem/den128) is as large as possible. Scale by multiplying low
        // and rem by 10 and subtracting one from the exponent. We could do this
        // with a loop, but it's more efficient to use logarithms.
        auto const roomToGrow = fl64 - log10Ceil (low);
        if (roomToGrow > 0)
        {
            exponent -= roomToGrow;
            low *= powerTable[roomToGrow];
            rem *= powerTable[roomToGrow];
        }
        auto const addRem = rem / den128;
        low += addRem;
        rem = rem - addRem * den128;
    }

    // The largest result we can have is ~2^95, which overflows the 64 bit
    // result we can store in the mantissa. Scale result down by dividing by ten
    // and adding one to the exponent until the low will fit in the 64-bit
    // mantissa. Use logarithms to avoid looping.
    bool hasRem = bool(rem);
    auto const mustShrink = log10Ceil (low) - fl64;
    if (mustShrink > 0)
    {
        uint128_t const sav (low);
        exponent += mustShrink;
        low /= powerTable[mustShrink];
        if (!hasRem)
            hasRem = bool(sav - low * powerTable[mustShrink]);
    }

    std::int64_t mantissa = low.convert_to<std::int64_t> ();

    // normalize before rounding
    if (neg)
        mantissa *= -1;

    IOUAmount result (mantissa, exponent);

    if (hasRem)
    {
        // handle rounding
        if (roundUp && !neg)
        {
            if (!result)
            {
                return IOUAmount (minMantissa, minExponent);
            }
            // This addition cannot overflow because the mantissa is already normalized
            return IOUAmount (result.mantissa () + 1, result.exponent ());
        }

        if (!roundUp && neg)
        {
            if (!result)
            {
                return IOUAmount (-minMantissa, minExponent);
            }
            // This subtraction cannot underflow because `result` is not zero
            return IOUAmount (result.mantissa () - 1, result.exponent ());
        }
    }

    return result;
}